

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeIntegerDebugType(Builder *this,int width,bool hasSign)

{
  key_type kVar1;
  char *__s;
  Id IVar2;
  Id IVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  reference ppIVar6;
  Instruction *pIVar7;
  value_type local_78;
  key_type local_70 [4];
  Instruction *pIStack_60;
  int t;
  Instruction *type;
  string local_50;
  Id local_2c;
  char *pcStack_28;
  Id nameId;
  char *typeName;
  bool hasSign_local;
  Builder *pBStack_18;
  int width_local;
  Builder *this_local;
  
  if (width == 8) {
    pcStack_28 = "uint8_t";
    if (hasSign) {
      pcStack_28 = "int8_t";
    }
  }
  else if (width == 0x10) {
    pcStack_28 = "uint16_t";
    if (hasSign) {
      pcStack_28 = "int16_t";
    }
  }
  else if (width == 0x40) {
    pcStack_28 = "uint64_t";
    if (hasSign) {
      pcStack_28 = "int64_t";
    }
  }
  else {
    pcStack_28 = "uint";
    if (hasSign) {
      pcStack_28 = "int";
    }
  }
  __s = pcStack_28;
  typeName._3_1_ = hasSign;
  typeName._4_4_ = width;
  pBStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,__s,(allocator<char> *)((long)&type + 7));
  IVar2 = getStringId(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&type + 7));
  local_70[3] = 0;
  local_2c = IVar2;
  do {
    kVar1 = local_70[3];
    local_70[2] = 2;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,local_70 + 2);
    sVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar4);
    if ((int)sVar5 <= (int)kVar1) {
      pIVar7 = (Instruction *)::operator_new(0x60);
      IVar2 = getUniqueId(this);
      IVar3 = makeVoidType(this);
      spv::Instruction::Instruction(pIVar7,IVar2,IVar3,OpExtInst);
      pIStack_60 = pIVar7;
      spv::Instruction::reserveOperands(pIVar7,6);
      spv::Instruction::addIdOperand(pIStack_60,this->nonSemanticShaderDebugInfo);
      spv::Instruction::addImmediateOperand(pIStack_60,2);
      spv::Instruction::addIdOperand(pIStack_60,local_2c);
      pIVar7 = pIStack_60;
      IVar2 = makeUintConstant(this,typeName._4_4_,false);
      spv::Instruction::addIdOperand(pIVar7,IVar2);
      pIVar7 = pIStack_60;
      if ((typeName._3_1_ & 1) == 1) {
        IVar2 = makeUintConstant(this,4,false);
        spv::Instruction::addIdOperand(pIVar7,IVar2);
      }
      else {
        IVar2 = makeUintConstant(this,6,false);
        spv::Instruction::addIdOperand(pIVar7,IVar2);
      }
      pIVar7 = pIStack_60;
      IVar2 = makeUintConstant(this,0,false);
      spv::Instruction::addIdOperand(pIVar7,IVar2);
      local_70[0] = 2;
      pmVar4 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedDebugTypes,local_70);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar4,&stack0xffffffffffffffa0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_78,
                 pIStack_60);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_78);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_78);
      Module::mapInstruction(&this->module,pIStack_60);
      IVar2 = spv::Instruction::getResultId(pIStack_60);
      return IVar2;
    }
    local_70[1] = 2;
    pmVar4 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,local_70 + 1);
    ppIVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar4,(long)(int)local_70[3]);
    pIStack_60 = *ppIVar6;
    IVar2 = spv::Instruction::getIdOperand(pIStack_60,0);
    if ((IVar2 == local_2c) &&
       (IVar2 = spv::Instruction::getIdOperand(pIStack_60,1), IVar2 == typeName._4_4_)) {
      IVar2 = spv::Instruction::getIdOperand(pIStack_60,2);
      IVar3 = 6;
      if ((typeName._3_1_ & 1) != 0) {
        IVar3 = 4;
      }
      if (IVar2 == IVar3) {
        IVar2 = spv::Instruction::getResultId(pIStack_60);
        return IVar2;
      }
    }
    local_70[3] = local_70[3] + 1;
  } while( true );
}

Assistant:

Id Builder::makeIntegerDebugType(int const width, bool const hasSign)
{
    const char* typeName = nullptr;
    switch (width) {
        case 8:  typeName = hasSign ? "int8_t" : "uint8_t"; break;
        case 16: typeName = hasSign ? "int16_t" : "uint16_t"; break;
        case 64: typeName = hasSign ? "int64_t" : "uint64_t"; break;
        default: typeName = hasSign ? "int" : "uint";
    }
    auto nameId = getStringId(typeName);
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].size(); ++t) {
        type = groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic][t];
        if (type->getIdOperand(0) == nameId &&
            type->getIdOperand(1) == static_cast<unsigned int>(width) &&
            type->getIdOperand(2) == (hasSign ? NonSemanticShaderDebugInfo100Signed : NonSemanticShaderDebugInfo100Unsigned))
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(6);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypeBasic);
    type->addIdOperand(nameId); // name id
    type->addIdOperand(makeUintConstant(width)); // size id
    if(hasSign == true) {
        type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100Signed)); // encoding id
    } else {
        type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100Unsigned)); // encoding id
    }
    type->addIdOperand(makeUintConstant(NonSemanticShaderDebugInfo100None)); // flags id

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}